

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recycler.cpp
# Opt level: O1

void __thiscall
Memory::Recycler::GetNormalHeapBlockAllocatorInfoForNativeAllocation
          (Recycler *this,size_t allocSize,void **allocatorAddress,uint32 *endAddressOffset,
          uint32 *freeListOffset,bool allowBumpAllocation,bool isOOPJIT)

{
  uint32 uVar1;
  undefined4 *puVar2;
  code *pcVar3;
  bool bVar4;
  byte bVar5;
  uint32 uVar6;
  char *pcVar7;
  TBlockAllocatorType *pTVar8;
  undefined8 *in_FS_OFFSET;
  
  if (allocSize == 0 || (allocSize & 0xf) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x59a,"(HeapInfo::IsAlignedSize(allocSize))",
                       "HeapInfo::IsAlignedSize(allocSize)");
    if (!bVar4) goto LAB_00268ff3;
    *puVar2 = 0;
  }
  if (0x300 < allocSize) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar2 = (undefined4 *)*in_FS_OFFSET;
    *puVar2 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                       ,0x59b,"(HeapInfo::IsSmallObject(allocSize))",
                       "HeapInfo::IsSmallObject(allocSize)");
    if (!bVar4) goto LAB_00268ff3;
    *puVar2 = 0;
  }
  pTVar8 = &(this->autoHeap).defaultHeap.heapBuckets[(int)(allocSize >> 4) - 1].heapBucket.
            super_SmallNormalHeapBucketBase<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>
            .super_HeapBucketT<Memory::SmallNormalHeapBlockT<SmallAllocationBlockAttributes>_>.
            allocatorHead;
  *allocatorAddress = pTVar8;
  *endAddressOffset = 0;
  *freeListOffset = 8;
  if (!isOOPJIT) {
    pcVar7 = GetAddressOfAllocator<(Memory::ObjectInfoBits)0>(this,allocSize);
    if (pTVar8 != (TBlockAllocatorType *)pcVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5a9,"(allocatorAddress == GetAddressOfAllocator<NoBit>(allocSize))",
                         "allocatorAddress == GetAddressOfAllocator<NoBit>(allocSize)");
      if (!bVar4) goto LAB_00268ff3;
      *puVar2 = 0;
    }
    uVar1 = *endAddressOffset;
    uVar6 = GetEndAddressOffset<(Memory::ObjectInfoBits)0>(this,allocSize);
    if (uVar1 != uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5aa,"(endAddressOffset == GetEndAddressOffset<NoBit>(allocSize))",
                         "endAddressOffset == GetEndAddressOffset<NoBit>(allocSize)");
      if (!bVar4) goto LAB_00268ff3;
      *puVar2 = 0;
    }
    uVar1 = *freeListOffset;
    uVar6 = GetFreeObjectListOffset<(Memory::ObjectInfoBits)0>(this,allocSize);
    if (uVar1 != uVar6) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5ab,"(freeListOffset == GetFreeObjectListOffset<NoBit>(allocSize))",
                         "freeListOffset == GetFreeObjectListOffset<NoBit>(allocSize)");
      if (!bVar4) goto LAB_00268ff3;
      *puVar2 = 0;
    }
    if ((this->trackerDictionary == (TypeInfotoTrackerItemMap *)0x0) &&
       (this->verifyEnabled == false)) {
      bVar5 = this->isPageHeapEnabled ^ 1;
    }
    else {
      bVar5 = 0;
    }
    if ((bool)bVar5 != allowBumpAllocation) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar2 = (undefined4 *)*in_FS_OFFSET;
      *puVar2 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Recycler.cpp"
                         ,0x5ac,"(allowBumpAllocation == AllowNativeCodeBumpAllocation())",
                         "allowBumpAllocation == AllowNativeCodeBumpAllocation()");
      if (!bVar4) {
LAB_00268ff3:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar2 = 0;
    }
  }
  if (!allowBumpAllocation) {
    *freeListOffset = *endAddressOffset;
  }
  return;
}

Assistant:

void Recycler::GetNormalHeapBlockAllocatorInfoForNativeAllocation(size_t allocSize, void*& allocatorAddress, uint32& endAddressOffset, uint32& freeListOffset, bool allowBumpAllocation, bool isOOPJIT)
{
    Assert(HeapInfo::IsAlignedSize(allocSize));
    Assert(HeapInfo::IsSmallObject(allocSize));

    allocatorAddress = (char*)this + offsetof(Recycler, autoHeap)
        + offsetof(HeapInfoManager, defaultHeap)
        + offsetof(HeapInfo, heapBuckets)
        + sizeof(HeapBucketGroup<SmallAllocationBlockAttributes>)*((uint)(allocSize >> HeapConstants::ObjectAllocationShift) - 1)
        + HeapBucketGroup<SmallAllocationBlockAttributes>::GetHeapBucketOffset()
        + HeapBucketT<SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::GetAllocatorHeadOffset();

    endAddressOffset = SmallHeapBlockAllocator<SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::GetEndAddressOffset();
    freeListOffset = SmallHeapBlockAllocator<SmallNormalHeapBlockT<SmallAllocationBlockAttributes>>::GetFreeObjectListOffset();;

    if (!isOOPJIT)
    {
        Assert(allocatorAddress == GetAddressOfAllocator<NoBit>(allocSize));
        Assert(endAddressOffset == GetEndAddressOffset<NoBit>(allocSize));
        Assert(freeListOffset == GetFreeObjectListOffset<NoBit>(allocSize));
        Assert(allowBumpAllocation == AllowNativeCodeBumpAllocation());
    }

    if (!allowBumpAllocation)
    {
        freeListOffset = endAddressOffset;
    }
}